

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O3

int __thiscall Js::ConcatStringBuilder::GetItemCount(ConcatStringBuilder *this)

{
  int count;
  int iVar1;
  
  iVar1 = 0;
  do {
    iVar1 = iVar1 + this->m_count;
    this = (this->m_prevChunk).ptr;
  } while (this != (ConcatStringBuilder *)0x0);
  return iVar1;
}

Assistant:

int ConcatStringBuilder::GetItemCount() const
    {
        int count = 0;
        const ConcatStringBuilder* current = this;
        while (current != NULL)
        {
            count += current->m_count;
            current = current->m_prevChunk;
        }
        return count;
    }